

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestFilters(ConsoleReporter *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  string local_48;
  Colour local_11;
  ConsoleReporter *pCStack_10;
  Colour guard;
  ConsoleReporter *this_local;
  
  pCStack_10 = this;
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config);
  iVar2 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    Colour::Colour(&local_11,BrightYellow);
    poVar4 = std::operator<<((ostream *)
                             (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             "Filters: ");
    peVar3 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config);
    iVar2 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters(&local_48,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var_00,iVar2));
    poVar4 = std::operator<<(poVar4,(string *)&local_48);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)&local_48);
    Colour::~Colour(&local_11);
  }
  return;
}

Assistant:

void ConsoleReporter::printTestFilters() {
    if (m_config->testSpec().hasFilters()) {
        Colour guard(Colour::BrightYellow);
        stream << "Filters: " << serializeFilters(m_config->getTestsOrTags()) << '\n';
    }
}